

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O0

int replay_get_next_recorded_victim_internal(__cilkrts_worker *w)

{
  __cilkrts_worker *w_local;
  int local_4;
  
  if (w->l->replay_list_entry->m_type == ped_type_steal) {
    local_4 = (int)w->l->replay_list_entry->m_value;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int replay_get_next_recorded_victim_internal(__cilkrts_worker *w)
{
    // If the next record isn't a STEAL, abort the attempt to steal work
    if (ped_type_steal != w->l->replay_list_entry->m_type)
        return -1;

    // Return the victim's worker ID from the STEAL record.  We'll check
    // the pedigree after random_steal has locked the victim worker.
    return w->l->replay_list_entry->m_value;
}